

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O3

void __thiscall capnp::DynamicValue::Reader::Reader(Reader *this,Reader *other)

{
  size_t sVar1;
  undefined4 uVar2;
  long lVar3;
  
  if (other->type == CAPABILITY) {
    this->type = CAPABILITY;
    sVar1 = (other->field_1).textValue.super_StringPtr.content.size_;
    (this->field_1).intValue = (other->field_1).intValue;
    (this->field_1).textValue.super_StringPtr.content.size_ = sVar1;
    (other->field_1).textValue.super_StringPtr.content.size_ = 0;
    (this->field_1).listValue.reader.segment = (other->field_1).listValue.reader.segment;
    return;
  }
  for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
    uVar2 = *(undefined4 *)&other->field_0x4;
    this->type = other->type;
    *(undefined4 *)&this->field_0x4 = uVar2;
    other = (Reader *)&other->field_1;
    this = (Reader *)&this->field_1;
  }
  return;
}

Assistant:

DynamicValue::Reader::Reader(Reader&& other) noexcept {
  switch (other.type) {
    case UNKNOWN:
    case VOID:
    case BOOL:
    case INT:
    case UINT:
    case FLOAT:
    case TEXT:
    case DATA:
    case LIST:
    case ENUM:
    case STRUCT:
    case ANY_POINTER:
      KJ_ASSERT_CAN_MEMCPY(Text::Reader);
      KJ_ASSERT_CAN_MEMCPY(Data::Reader);
      KJ_ASSERT_CAN_MEMCPY(DynamicList::Reader);
      KJ_ASSERT_CAN_MEMCPY(DynamicEnum);
      KJ_ASSERT_CAN_MEMCPY(DynamicStruct::Reader);
      KJ_ASSERT_CAN_MEMCPY(AnyPointer::Reader);
      break;

    case CAPABILITY:
      type = CAPABILITY;
      kj::ctor(capabilityValue, kj::mv(other.capabilityValue));
      return;
  }

  memcpy(this, &other, sizeof(*this));
}